

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxColorLiteral::Resolve(FxColorLiteral *this,FCompileContext *ctx)

{
  FArgumentList *this_00;
  uint uVar1;
  long *plVar2;
  long lVar3;
  PInt *pPVar4;
  char cVar5;
  undefined8 uVar6;
  FxColorLiteral *pFVar7;
  int iVar8;
  byte bVar9;
  FString *other;
  long lVar10;
  int iVar11;
  FxExpression *local_48;
  FString local_40;
  FCompileContext *local_38;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    this_00 = &this->ArgList;
    uVar1 = (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    local_38 = ctx;
    if (uVar1 == 3) {
      local_48 = (FxExpression *)0x0;
      TArray<FxExpression_*,_FxExpression_*>::Insert
                (&this_00->super_TArray<FxExpression_*,_FxExpression_*>,0,&local_48);
    }
    else if (uVar1 != 4) {
      __assert_fail("ArgList.Size() == 3 || ArgList.Size() == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x20ce,"virtual FxExpression *FxColorLiteral::Resolve(FCompileContext &)");
    }
    bVar9 = 0x18;
    lVar10 = 0;
    iVar11 = 0;
    do {
      plVar2 = *(long **)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                         lVar10);
      if (plVar2 == (long *)0x0) {
LAB_00538fd8:
        iVar11 = iVar11 + 1;
      }
      else {
        uVar6 = (**(code **)(*plVar2 + 0x10))(plVar2,local_38);
        *(undefined8 *)
         ((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array + lVar10) = uVar6;
        lVar3 = *(long *)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                         lVar10);
        if (lVar3 == 0) {
LAB_00539093:
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          return (FxExpression *)0x0;
        }
        cVar5 = (**(code **)(**(long **)(lVar3 + 0x18) + 0x40))();
        if ((cVar5 == '\0') || (*(char *)(*(long *)(lVar3 + 0x18) + 0x6b) != '\0')) {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Integer expected for color component");
          goto LAB_00539093;
        }
        cVar5 = (**(code **)(**(long **)((long)(this_00->
                                               super_TArray<FxExpression_*,_FxExpression_*>).Array +
                                        lVar10) + 0x18))();
        if (cVar5 != '\0') {
          lVar3 = *(long *)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                           lVar10);
          local_48 = *(FxExpression **)(lVar3 + 0x28);
          other = (FString *)(lVar3 + 0x30);
          if (local_48 == (FxExpression *)TypeString) {
            FString::AttachToOther(&local_40,other);
          }
          else {
            local_40.Chars = other->Chars;
          }
          cVar5 = *(char *)((long)&local_48[2].ValueType + 3);
          if (cVar5 == '\x01') {
            iVar8 = (int)(double)local_40.Chars;
          }
          else {
            iVar8 = 0;
            if (cVar5 == '\0') {
              iVar8 = (int)local_40.Chars;
            }
          }
          if (0xfe < iVar8) {
            iVar8 = 0xff;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          this->constval = this->constval + (iVar8 << (bVar9 & 0x1f));
          if (local_48 == (FxExpression *)TypeString) {
            FString::~FString(&local_40);
          }
          plVar2 = *(long **)((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array +
                             lVar10);
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 8))();
          }
          *(undefined8 *)
           ((long)(this_00->super_TArray<FxExpression_*,_FxExpression_*>).Array + lVar10) = 0;
          goto LAB_00538fd8;
        }
      }
      bVar9 = bVar9 - 8;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x20);
    if (iVar11 == 4) {
      pFVar7 = (FxColorLiteral *)FMemArena::Alloc(&FxAlloc,0x38);
      uVar1 = this->constval;
      (pFVar7->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(pFVar7->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (pFVar7->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar7->super_FxExpression).isresolved = false;
      (pFVar7->super_FxExpression).NeedResult = true;
      (pFVar7->super_FxExpression).ExprType = EFX_Constant;
      (pFVar7->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      pPVar4 = TypeSInt32;
      (pFVar7->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
           (FxExpression **)TypeSInt32;
      (pFVar7->super_FxExpression).ValueType = (PType *)pPVar4;
      (pFVar7->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = uVar1;
      (pFVar7->super_FxExpression).isresolved = true;
      (pFVar7->super_FxExpression).ValueType = (PType *)TypeColor;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = pFVar7;
    }
    else {
      (this->super_FxExpression).ValueType = (PType *)TypeColor;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxColorLiteral::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	unsigned constelements = 0;
	assert(ArgList.Size() == 3 || ArgList.Size() == 4);
	if (ArgList.Size() == 3) ArgList.Insert(0, nullptr);
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			SAFE_RESOLVE(ArgList[i], ctx);
			if (!ArgList[i]->IsInteger())
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for color component");
				delete this;
				return nullptr;
			}
			if (ArgList[i]->isConstant())
			{
				constval += clamp(static_cast<FxConstant *>(ArgList[i])->GetValue().GetInt(), 0, 255) << (24 - i * 8);
				delete ArgList[i];
				ArgList[i] = nullptr;
				constelements++;
			}
		}
		else constelements++;
	}
	if (constelements == 4)
	{
		auto x = new FxConstant(constval, ScriptPosition);
		x->ValueType = TypeColor;
		delete this;
		return x;
	}
	ValueType = TypeColor;
	return this;
}